

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::FillDynamicLayerParams::ByteSizeLong(FillDynamicLayerParams *this)

{
  bool bVar1;
  int size;
  long lVar2;
  float fVar3;
  int cached_size;
  uint32_t raw_value;
  float tmp_value;
  uint32_t cached_has_bits;
  size_t total_size;
  FillDynamicLayerParams *this_local;
  
  _tmp_value = 0;
  fVar3 = _internal_value(this);
  if (fVar3 != 0.0) {
    _tmp_value = 5;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar2 = std::__cxx11::string::size();
    _tmp_value = lVar2 + _tmp_value;
  }
  size = google::protobuf::internal::ToCachedSize(_tmp_value);
  SetCachedSize(this,size);
  return _tmp_value;
}

Assistant:

size_t FillDynamicLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.FillDynamicLayerParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // float value = 1;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_value = this->_internal_value();
  uint32_t raw_value;
  memcpy(&raw_value, &tmp_value, sizeof(tmp_value));
  if (raw_value != 0) {
    total_size += 1 + 4;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}